

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d1_both.cc
# Opt level: O0

void bssl::dtls_clear_unused_write_epochs(SSL *ssl)

{
  SSL *ssl_local;
  
  InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,bssl::internal::Deleter>,2ul>::
  EraseIf<bssl::dtls_clear_unused_write_epochs(ssl_st*)::__0>
            ((InplaceVector<std::unique_ptr<bssl::DTLSWriteEpoch,bssl::internal::Deleter>,2ul> *)
             &ssl->d1->extra_write_epochs,(anon_class_8_1_ba1d796c_for__M_pred)ssl);
  return;
}

Assistant:

void dtls_clear_unused_write_epochs(SSL *ssl) {
  ssl->d1->extra_write_epochs.EraseIf(
      [ssl](const UniquePtr<DTLSWriteEpoch> &write_epoch) -> bool {
        // Non-current epochs may be discarded once there are no incomplete
        // outgoing messages that reference them.
        //
        // TODO(crbug.com/42290594): Epoch 1 (0-RTT) should be retained until
        // epoch 3 (app data) is available.
        for (const auto &msg : ssl->d1->outgoing_messages) {
          if (msg.epoch == write_epoch->epoch() && !msg.IsFullyAcked()) {
            return false;
          }
        }
        return true;
      });
}